

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestStartCommand.cxx
# Opt level: O3

bool __thiscall
cmCTestStartCommand::InitialPass
          (cmCTestStartCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  ulong uVar1;
  pointer pcVar2;
  cmMakefile *pcVar3;
  cmCTest *pcVar4;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  ostream *poVar8;
  char *__s;
  ulong uVar9;
  pointer pbVar10;
  string startLogFile;
  string sourceDir;
  string binaryDir;
  cmGeneratedFileStream ofs;
  ostringstream cmCTestLog_msg_3;
  pointer local_488;
  pointer local_480;
  pointer local_478;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  undefined1 local_3f0 [32];
  byte abStack_3d0 [80];
  ios_base local_380 [472];
  undefined1 local_1a8 [16];
  _func_int *local_198 [12];
  ios_base local_138 [264];
  
  pbVar10 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar10 ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_3f0._0_8_ = local_3f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3f0,"called with incorrect number of arguments","");
    cmCommand::SetError((cmCommand *)this,(string *)local_3f0);
LAB_0019ddc0:
    if ((undefined1 *)local_3f0._0_8_ != local_3f0 + 0x10) {
      operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ + 1);
    }
    return false;
  }
  local_480 = (pointer)0x0;
  local_488 = (pointer)0x0;
  local_478 = (pointer)0x0;
  uVar9 = 0;
  do {
    iVar6 = std::__cxx11::string::compare((char *)(pbVar10 + uVar9));
    if (iVar6 == 0) {
      uVar1 = uVar9 + 1;
      pbVar10 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (uVar1 < (ulong)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10 >> 5)) {
        iVar6 = std::__cxx11::string::compare((char *)(pbVar10 + uVar1));
        if ((iVar6 != 0) &&
           (iVar6 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar1)),
           iVar6 != 0)) {
          cmCTest::SetSpecificTrack
                    ((this->super_cmCTestCommand).CTest,
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar1]._M_dataplus._M_p);
          uVar9 = uVar9 + 2;
          goto LAB_0019d3d8;
        }
      }
      local_3f0._0_8_ = local_3f0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3f0,"TRACK argument missing track name","");
      cmCommand::SetError((cmCommand *)this,(string *)local_3f0);
      goto LAB_0019ddc0;
    }
    iVar6 = std::__cxx11::string::compare
                      ((char *)((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar9));
    if (iVar6 == 0) {
      uVar9 = uVar9 + 1;
      this->CreateNewTag = false;
    }
    else {
      iVar6 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar9));
      if (iVar6 == 0) {
        uVar9 = uVar9 + 1;
        this->Quiet = true;
      }
      else {
        if (local_478 == (pointer)0x0) {
          local_478 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[uVar9]._M_dataplus._M_p;
        }
        else if (local_488 == (pointer)0x0) {
          local_488 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[uVar9]._M_dataplus._M_p;
        }
        else {
          if (local_480 != (pointer)0x0) {
            local_3f0._0_8_ = local_3f0 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_3f0,"Too many arguments","");
            cmCommand::SetError((cmCommand *)this,(string *)local_3f0);
            goto LAB_0019ddc0;
          }
          local_480 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[uVar9]._M_dataplus._M_p;
        }
        uVar9 = uVar9 + 1;
      }
    }
LAB_0019d3d8:
    pbVar10 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  } while (uVar9 < (ulong)((long)(args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10 >> 5));
  if (local_488 == (pointer)0x0) {
    pcVar3 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
    local_3f0._0_8_ = local_3f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,"CTEST_SOURCE_DIRECTORY","")
    ;
    local_488 = cmMakefile::GetDefinition(pcVar3,(string *)local_3f0);
    if ((undefined1 *)local_3f0._0_8_ != local_3f0 + 0x10) {
      operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ + 1);
    }
  }
  if (local_480 == (pointer)0x0) {
    pcVar3 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
    local_3f0._0_8_ = local_3f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,"CTEST_BINARY_DIRECTORY","")
    ;
    local_480 = cmMakefile::GetDefinition(pcVar3,(string *)local_3f0);
    if ((undefined1 *)local_3f0._0_8_ != local_3f0 + 0x10) {
      operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ + 1);
    }
  }
  if (local_488 == (char *)0x0) {
    local_3f0._0_8_ = local_3f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3f0,
               "source directory not specified. Specify source directory as an argument or set CTEST_SOURCE_DIRECTORY"
               ,"");
    cmCommand::SetError((cmCommand *)this,(string *)local_3f0);
    goto LAB_0019ddc0;
  }
  if (local_480 == (char *)0x0) {
    local_3f0._0_8_ = local_3f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3f0,
               "binary directory not specified. Specify binary directory as an argument or set CTEST_BINARY_DIRECTORY"
               ,"");
    cmCommand::SetError((cmCommand *)this,(string *)local_3f0);
    goto LAB_0019ddc0;
  }
  if ((local_478 == (char *)0x0) && (this->CreateNewTag == true)) {
    local_3f0._0_8_ = local_3f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3f0,
               "no test model specified and APPEND not specified. Specify either a test model or the APPEND argument"
               ,"");
    cmCommand::SetError((cmCommand *)this,(string *)local_3f0);
    goto LAB_0019ddc0;
  }
  pcVar2 = local_3f0 + 0x10;
  local_3f0._0_8_ = pcVar2;
  sVar7 = strlen(local_488);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,local_488,local_488 + sVar7);
  cmsys::SystemTools::AddKeepPath((string *)local_3f0);
  if ((pointer)local_3f0._0_8_ != pcVar2) {
    operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ + 1);
  }
  local_3f0._0_8_ = pcVar2;
  sVar7 = strlen(local_480);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,local_480,local_480 + sVar7);
  cmsys::SystemTools::AddKeepPath((string *)local_3f0);
  if ((pointer)local_3f0._0_8_ != pcVar2) {
    operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ + 1);
  }
  cmCTest::EmptyCTestConfiguration((this->super_cmCTestCommand).CTest);
  local_3f0._0_8_ = pcVar2;
  sVar7 = strlen(local_488);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,local_488,local_488 + sVar7);
  cmsys::SystemTools::CollapseFullPath(&local_430,(string *)local_3f0);
  if ((pointer)local_3f0._0_8_ != pcVar2) {
    operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ + 1);
  }
  local_3f0._0_8_ = pcVar2;
  sVar7 = strlen(local_480);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,local_480,local_480 + sVar7);
  cmsys::SystemTools::CollapseFullPath(&local_410,(string *)local_3f0);
  if ((pointer)local_3f0._0_8_ != pcVar2) {
    operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ + 1);
  }
  cmCTest::SetCTestConfiguration
            ((this->super_cmCTestCommand).CTest,"SourceDirectory",local_430._M_dataplus._M_p,
             this->Quiet);
  cmCTest::SetCTestConfiguration
            ((this->super_cmCTestCommand).CTest,"BuildDirectory",local_410._M_dataplus._M_p,
             this->Quiet);
  if (local_478 == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3f0,"Run dashboard with to-be-determined model",0x29);
    std::ios::widen((char)(ostream *)local_3f0 + (char)*(undefined8 *)(local_3f0._0_8_ + -0x18));
    std::ostream::put((char)local_3f0);
    poVar8 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"   Source directory: ",0x15);
    sVar7 = strlen(local_488);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_488,sVar7);
    std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
    std::ostream::put((char)poVar8);
    poVar8 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"   Build directory: ",0x14);
    sVar7 = strlen(local_480);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_480,sVar7);
    std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    pcVar4 = (this->super_cmCTestCommand).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar4,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestStartCommand.cxx"
                 ,0x72,(char *)local_1a8._0_8_,this->Quiet);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3f0,"Run dashboard with model ",0x19);
    sVar7 = strlen(local_478);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,local_478,sVar7);
    std::ios::widen((char)(ostream *)local_3f0 + (char)*(undefined8 *)(local_3f0._0_8_ + -0x18));
    std::ostream::put((char)local_3f0);
    poVar8 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"   Source directory: ",0x15);
    sVar7 = strlen(local_488);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_488,sVar7);
    std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
    std::ostream::put((char)poVar8);
    poVar8 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"   Build directory: ",0x14);
    sVar7 = strlen(local_480);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_480,sVar7);
    std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    pcVar4 = (this->super_cmCTestCommand).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar4,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestStartCommand.cxx"
                 ,0x6a,(char *)local_1a8._0_8_,this->Quiet);
  }
  if ((_func_int **)local_1a8._0_8_ != local_198) {
    operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0] + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
  std::ios_base::~ios_base(local_380);
  __s = cmCTest::GetSpecificTrack((this->super_cmCTestCommand).CTest);
  if (__s != (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,"   Track: ",10);
    sVar7 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,__s,sVar7);
    std::ios::widen((char)(ostream *)local_3f0 + (char)*(undefined8 *)(local_3f0._0_8_ + -0x18));
    std::ostream::put((char)local_3f0);
    std::ostream::flush();
    pcVar4 = (this->super_cmCTestCommand).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar4,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestStartCommand.cxx"
                 ,0x77,(char *)local_1a8._0_8_,this->Quiet);
    if ((_func_int **)local_1a8._0_8_ != local_198) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0] + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
    std::ios_base::~ios_base(local_380);
  }
  local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_450,local_410._M_dataplus._M_p,
             local_410._M_dataplus._M_p + local_410._M_string_length);
  std::__cxx11::string::append((char *)&local_450);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_3f0,&local_450,false,None);
  if ((abStack_3d0[*(long *)(local_3f0._0_8_ + -0x18)] & 5) == 0) {
    bVar5 = InitialCheckout(this,(ostream *)local_3f0,&local_430);
    if (bVar5) {
      bVar5 = cmsys::SystemTools::FileIsDirectory(&local_430);
      if (bVar5) {
        cmCTest::SetRunCurrentScript((this->super_cmCTestCommand).CTest,false);
        cmCTest::SetSuppressUpdatingCTestConfiguration((this->super_cmCTestCommand).CTest,true);
        if (local_478 == (char *)0x0) {
          iVar6 = -1;
        }
        else {
          iVar6 = cmCTest::GetTestModelFromString(local_478);
        }
        cmCTest::SetTestModel((this->super_cmCTestCommand).CTest,iVar6);
        cmCTest::SetProduceXML((this->super_cmCTestCommand).CTest,true);
        bVar5 = cmCTest::InitializeFromCommand((this->super_cmCTestCommand).CTest,this);
        goto LAB_0019dd27;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"given source path\n",0x12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_430._M_dataplus._M_p,local_430._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"which is not an existing directory.  ",0x25);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"Set CTEST_CHECKOUT_COMMAND to a command line to create it.",0x3a);
      std::__cxx11::stringbuf::str();
      cmCommand::SetError((cmCommand *)this,&local_470);
      goto LAB_0019dc8b;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Cannot create log file: LastStart.log",0x25);
    std::ios::widen((char)(ostream *)local_1a8 + (char)*(_func_int **)(local_1a8._0_8_ + -0x18));
    std::ostream::put((char)local_1a8);
    std::ostream::flush();
    pcVar4 = (this->super_cmCTestCommand).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar4,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestStartCommand.cxx"
                 ,0x7f,local_470._M_dataplus._M_p,false);
LAB_0019dc8b:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_470._M_dataplus._M_p != &local_470.field_2) {
      operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  bVar5 = false;
LAB_0019dd27:
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_3f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p == &local_430.field_2) {
    return bVar5;
  }
  operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
  return bVar5;
}

Assistant:

bool cmCTestStartCommand::InitialPass(std::vector<std::string> const& args,
                                      cmExecutionStatus& /*unused*/)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  size_t cnt = 0;
  const char* smodel = nullptr;
  const char* src_dir = nullptr;
  const char* bld_dir = nullptr;

  while (cnt < args.size()) {
    if (args[cnt] == "TRACK") {
      cnt++;
      if (cnt >= args.size() || args[cnt] == "APPEND" ||
          args[cnt] == "QUIET") {
        this->SetError("TRACK argument missing track name");
        return false;
      }
      this->CTest->SetSpecificTrack(args[cnt].c_str());
      cnt++;
    } else if (args[cnt] == "APPEND") {
      cnt++;
      this->CreateNewTag = false;
    } else if (args[cnt] == "QUIET") {
      cnt++;
      this->Quiet = true;
    } else if (!smodel) {
      smodel = args[cnt].c_str();
      cnt++;
    } else if (!src_dir) {
      src_dir = args[cnt].c_str();
      cnt++;
    } else if (!bld_dir) {
      bld_dir = args[cnt].c_str();
      cnt++;
    } else {
      this->SetError("Too many arguments");
      return false;
    }
  }

  if (!src_dir) {
    src_dir = this->Makefile->GetDefinition("CTEST_SOURCE_DIRECTORY");
  }
  if (!bld_dir) {
    bld_dir = this->Makefile->GetDefinition("CTEST_BINARY_DIRECTORY");
  }
  if (!src_dir) {
    this->SetError("source directory not specified. Specify source directory "
                   "as an argument or set CTEST_SOURCE_DIRECTORY");
    return false;
  }
  if (!bld_dir) {
    this->SetError("binary directory not specified. Specify binary directory "
                   "as an argument or set CTEST_BINARY_DIRECTORY");
    return false;
  }
  if (!smodel && this->CreateNewTag) {
    this->SetError("no test model specified and APPEND not specified. Specify "
                   "either a test model or the APPEND argument");
    return false;
  }

  cmSystemTools::AddKeepPath(src_dir);
  cmSystemTools::AddKeepPath(bld_dir);

  this->CTest->EmptyCTestConfiguration();

  std::string sourceDir = cmSystemTools::CollapseFullPath(src_dir);
  std::string binaryDir = cmSystemTools::CollapseFullPath(bld_dir);
  this->CTest->SetCTestConfiguration("SourceDirectory", sourceDir.c_str(),
                                     this->Quiet);
  this->CTest->SetCTestConfiguration("BuildDirectory", binaryDir.c_str(),
                                     this->Quiet);

  if (smodel) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "Run dashboard with model "
                         << smodel << std::endl
                         << "   Source directory: " << src_dir << std::endl
                         << "   Build directory: " << bld_dir << std::endl,
                       this->Quiet);
  } else {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "Run dashboard with "
                       "to-be-determined model"
                         << std::endl
                         << "   Source directory: " << src_dir << std::endl
                         << "   Build directory: " << bld_dir << std::endl,
                       this->Quiet);
  }
  const char* track = this->CTest->GetSpecificTrack();
  if (track) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "   Track: " << track << std::endl, this->Quiet);
  }

  // Log startup actions.
  std::string startLogFile = binaryDir + "/Testing/Temporary/LastStart.log";
  cmGeneratedFileStream ofs(startLogFile);
  if (!ofs) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot create log file: LastStart.log" << std::endl);
    return false;
  }

  // Make sure the source directory exists.
  if (!this->InitialCheckout(ofs, sourceDir)) {
    return false;
  }
  if (!cmSystemTools::FileIsDirectory(sourceDir)) {
    std::ostringstream e;
    e << "given source path\n"
      << "  " << sourceDir << "\n"
      << "which is not an existing directory.  "
      << "Set CTEST_CHECKOUT_COMMAND to a command line to create it.";
    this->SetError(e.str());
    return false;
  }

  this->CTest->SetRunCurrentScript(false);
  this->CTest->SetSuppressUpdatingCTestConfiguration(true);
  int model;
  if (smodel) {
    model = cmCTest::GetTestModelFromString(smodel);
  } else {
    model = cmCTest::UNKNOWN;
  }
  this->CTest->SetTestModel(model);
  this->CTest->SetProduceXML(true);

  return this->CTest->InitializeFromCommand(this);
}